

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O2

bool __thiscall dg::pta::PointerIdPointsToSet::add(PointerIdPointsToSet *this,Pointer *ptr)

{
  type tVar1;
  bool bVar2;
  size_t i;
  Pointer local_28;
  
  tVar1 = Offset::UNKNOWN;
  local_28.target = ptr->target;
  local_28.offset.offset = Offset::UNKNOWN;
  bVar2 = has(this,&local_28);
  if (bVar2) {
    bVar2 = false;
  }
  else if ((ptr->offset).offset == tVar1) {
    bVar2 = addWithUnknownOffset(this,ptr->target);
  }
  else {
    i = getPointerID(ptr);
    bVar2 = ADT::
            SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
            ::set(&this->pointers,i);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool add(const Pointer &ptr) {
        if (has({ptr.target, Offset::UNKNOWN})) {
            return false;
        }
        if (ptr.offset.isUnknown()) {
            return addWithUnknownOffset(ptr.target);
        }
        return !pointers.set(getPointerID(ptr));
    }